

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void js_free_message_pipe(JSWorkerMessagePipe *ps)

{
  JSWorkerMessage *pJVar1;
  JSWorkerMessage *msg;
  
  if (ps != (JSWorkerMessagePipe *)0x0) {
    LOCK();
    ps->ref_count = ps->ref_count + -1;
    UNLOCK();
    if (ps->ref_count == 0) {
      msg = (JSWorkerMessage *)(ps->msg_queue).next;
      while (msg != (JSWorkerMessage *)&ps->msg_queue) {
        pJVar1 = (JSWorkerMessage *)(msg->link).next;
        js_free_message(msg);
        msg = pJVar1;
      }
      pthread_mutex_destroy((pthread_mutex_t *)&ps->mutex);
      close(ps->read_fd);
      close(ps->write_fd);
      free(ps);
      return;
    }
  }
  return;
}

Assistant:

static void js_free_message_pipe(JSWorkerMessagePipe *ps)
{
    struct list_head *el, *el1;
    JSWorkerMessage *msg;
    int ref_count;
    
    if (!ps)
        return;
    
    ref_count = atomic_add_int(&ps->ref_count, -1);
    assert(ref_count >= 0);
    if (ref_count == 0) {
        list_for_each_safe(el, el1, &ps->msg_queue) {
            msg = list_entry(el, JSWorkerMessage, link);
            js_free_message(msg);
        }
        pthread_mutex_destroy(&ps->mutex);
        close(ps->read_fd);
        close(ps->write_fd);
        free(ps);
    }
}